

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_source_generator_base.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::csharp::SourceGeneratorBase::class_access_level_abi_cxx11_
          (string *__return_storage_ptr__,SourceGeneratorBase *this)

{
  bool bVar1;
  char *pcVar2;
  
  bVar1 = this->options_->internal_access;
  pcVar2 = "public";
  if (bVar1 != false) {
    pcVar2 = "internal";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (ulong)bVar1 * 2 + 6);
  return __return_storage_ptr__;
}

Assistant:

std::string SourceGeneratorBase::class_access_level() {
  return this->options()->internal_access ? "internal" : "public";
}